

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

Vec_Ptr_t * Scl_LibertyReadPinTimingAll(Scl_Tree_t *p,Scl_Item_t *pPinOut,char *pNameIn)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  char *__s1;
  Scl_Item_t *pSVar7;
  Scl_Item_t *pSVar8;
  
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x10;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(0x80);
  pVVar5->pArray = ppvVar6;
  uVar1 = pPinOut->Child;
  if (p->nItems <= (int)uVar1) {
LAB_003d18bf:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                  ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if ((int)uVar1 < 0) {
    pSVar8 = (Scl_Item_t *)0x0;
  }
  else {
    pSVar8 = p->pItems + uVar1;
  }
  do {
    if (pSVar8 == (Scl_Item_t *)0x0) {
      return pVVar5;
    }
    iVar4 = (pSVar8->Key).Beg;
    iVar3 = (pSVar8->Key).End - iVar4;
    iVar4 = strncmp(p->pContents + iVar4,"timing",(long)iVar3);
    if (iVar3 == 6 && iVar4 == 0) {
      uVar1 = pSVar8->Child;
      while( true ) {
        if (p->nItems <= (int)uVar1) goto LAB_003d18bf;
        if ((int)uVar1 < 0) {
          pSVar7 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar7 = p->pItems + uVar1;
        }
        if (pSVar7 == (Scl_Item_t *)0x0) break;
        iVar4 = (pSVar7->Key).Beg;
        iVar3 = (pSVar7->Key).End - iVar4;
        iVar4 = strncmp(p->pContents + iVar4,"related_pin",(long)iVar3);
        if (iVar3 == 0xb && iVar4 == 0) {
          __s1 = Scl_LibertyReadString(p,pSVar7->Head);
          iVar4 = strcmp(__s1,pNameIn);
          if (iVar4 == 0) {
            uVar1 = pVVar5->nSize;
            uVar2 = pVVar5->nCap;
            if (uVar1 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
                }
                iVar4 = 0x10;
              }
              else {
                iVar4 = uVar2 * 2;
                if (iVar4 <= (int)uVar2) goto LAB_003d1856;
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar2 << 4);
                }
              }
              pVVar5->pArray = ppvVar6;
              pVVar5->nCap = iVar4;
            }
LAB_003d1856:
            pVVar5->nSize = uVar1 + 1;
            pVVar5->pArray[(int)uVar1] = pSVar8;
          }
        }
        uVar1 = pSVar7->Next;
      }
    }
    uVar1 = pSVar8->Next;
    if (p->nItems <= (int)uVar1) goto LAB_003d18bf;
    if ((int)uVar1 < 0) {
      pSVar8 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar8 = p->pItems + uVar1;
    }
  } while( true );
}

Assistant:

Vec_Ptr_t * Scl_LibertyReadPinTimingAll( Scl_Tree_t * p, Scl_Item_t * pPinOut, char * pNameIn )
{
    Vec_Ptr_t * vTimings;
    Scl_Item_t * pTiming, * pPinIn;
    vTimings = Vec_PtrAlloc( 16 );
    Scl_ItemForEachChildName( p, pPinOut, pTiming, "timing" )
        Scl_ItemForEachChildName( p, pTiming, pPinIn, "related_pin" )
            if ( !strcmp(Scl_LibertyReadString(p, pPinIn->Head), pNameIn) )
                Vec_PtrPush( vTimings, pTiming );
    return vTimings;
}